

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Single_Quoted_String_
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  char *pcVar1;
  eval_error *this_00;
  char *pcVar2;
  char cVar3;
  bool bVar4;
  string local_50;
  File_Position local_30;
  
  pcVar1 = (this->m_position).m_pos;
  pcVar2 = (this->m_position).m_end;
  if ((pcVar1 == pcVar2) || (*pcVar1 != '\'')) {
    return false;
  }
  if (pcVar1 == pcVar2) {
    pcVar1 = "";
  }
  cVar3 = *pcVar1;
  do {
    Position::operator++(&this->m_position);
    do {
      pcVar1 = (this->m_position).m_pos;
      bVar4 = pcVar1 == (this->m_position).m_end;
      if (bVar4) {
LAB_004806f8:
        this_00 = (eval_error *)__cxa_allocate_exception(0x90);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Unclosed single-quoted string","");
        local_30.line = (this->m_position).line;
        local_30.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (this_00,&local_50,&local_30,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      if ((*pcVar1 == '\'') && (cVar3 != '\\')) {
        if (!bVar4) {
          Position::operator++(&this->m_position);
          return true;
        }
        goto LAB_004806f8;
      }
      bVar4 = Eol_(this,false);
    } while (bVar4);
    if (cVar3 == '\\') {
      cVar3 = '\0';
    }
    else {
      pcVar1 = (this->m_position).m_pos;
      pcVar2 = "";
      if (pcVar1 != (this->m_position).m_end) {
        pcVar2 = pcVar1;
      }
      cVar3 = *pcVar2;
    }
  } while( true );
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }